

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

DescriptorProto * __thiscall
perfetto::protos::gen::DescriptorProto::operator=(DescriptorProto *this,DescriptorProto *param_1)

{
  pointer pFVar1;
  pointer pDVar2;
  pointer pEVar3;
  pointer pOVar4;
  pointer pDVar5;
  pointer pbVar6;
  vector<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  local_38;
  
  ::std::__cxx11::string::operator=((string *)&this->name_,(string *)&param_1->name_);
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(this->field_).
                super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pFVar1 = (param_1->field_).
           super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->field_).
                super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(this->field_).
                super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->field_).
  super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->field_).
       super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->field_).
  super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish = pFVar1;
  (this->field_).
  super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->field_).
       super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->field_).
  super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->field_).
  super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->field_).
  super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
  ::~vector((vector<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
             *)&local_38);
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(this->extension_).
                super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pFVar1 = (param_1->extension_).
           super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->extension_).
                super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(this->extension_).
                super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->extension_).
  super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->extension_).
       super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->extension_).
  super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish = pFVar1;
  (this->extension_).
  super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->extension_).
       super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->extension_).
  super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->extension_).
  super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->extension_).
  super__Vector_base<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
  ::~vector((vector<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
             *)&local_38);
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->nested_type_).
       super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pDVar2 = (param_1->nested_type_).
           super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->nested_type_).
       super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->nested_type_).
       super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->nested_type_).
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->nested_type_).
       super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->nested_type_).
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish = pDVar2;
  (this->nested_type_).
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->nested_type_).
       super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->nested_type_).
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->nested_type_).
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->nested_type_).
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ::~vector(&local_38);
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(this->enum_type_).
                super__Vector_base<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pEVar3 = (param_1->enum_type_).
           super__Vector_base<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->enum_type_).
                super__Vector_base<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(this->enum_type_).
                super__Vector_base<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->enum_type_).
  super__Vector_base<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->enum_type_).
       super__Vector_base<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->enum_type_).
  super__Vector_base<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish = pEVar3;
  (this->enum_type_).
  super__Vector_base<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->enum_type_).
       super__Vector_base<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->enum_type_).
  super__Vector_base<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->enum_type_).
  super__Vector_base<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->enum_type_).
  super__Vector_base<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
  ::~vector((vector<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
             *)&local_38);
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(this->oneof_decl_).
                super__Vector_base<perfetto::protos::gen::OneofDescriptorProto,_std::allocator<perfetto::protos::gen::OneofDescriptorProto>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pOVar4 = (param_1->oneof_decl_).
           super__Vector_base<perfetto::protos::gen::OneofDescriptorProto,_std::allocator<perfetto::protos::gen::OneofDescriptorProto>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->oneof_decl_).
                super__Vector_base<perfetto::protos::gen::OneofDescriptorProto,_std::allocator<perfetto::protos::gen::OneofDescriptorProto>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(this->oneof_decl_).
                super__Vector_base<perfetto::protos::gen::OneofDescriptorProto,_std::allocator<perfetto::protos::gen::OneofDescriptorProto>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->oneof_decl_).
  super__Vector_base<perfetto::protos::gen::OneofDescriptorProto,_std::allocator<perfetto::protos::gen::OneofDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->oneof_decl_).
       super__Vector_base<perfetto::protos::gen::OneofDescriptorProto,_std::allocator<perfetto::protos::gen::OneofDescriptorProto>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->oneof_decl_).
  super__Vector_base<perfetto::protos::gen::OneofDescriptorProto,_std::allocator<perfetto::protos::gen::OneofDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish = pOVar4;
  (this->oneof_decl_).
  super__Vector_base<perfetto::protos::gen::OneofDescriptorProto,_std::allocator<perfetto::protos::gen::OneofDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->oneof_decl_).
       super__Vector_base<perfetto::protos::gen::OneofDescriptorProto,_std::allocator<perfetto::protos::gen::OneofDescriptorProto>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->oneof_decl_).
  super__Vector_base<perfetto::protos::gen::OneofDescriptorProto,_std::allocator<perfetto::protos::gen::OneofDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->oneof_decl_).
  super__Vector_base<perfetto::protos::gen::OneofDescriptorProto,_std::allocator<perfetto::protos::gen::OneofDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->oneof_decl_).
  super__Vector_base<perfetto::protos::gen::OneofDescriptorProto,_std::allocator<perfetto::protos::gen::OneofDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<perfetto::protos::gen::OneofDescriptorProto,_std::allocator<perfetto::protos::gen::OneofDescriptorProto>_>
  ::~vector((vector<perfetto::protos::gen::OneofDescriptorProto,_std::allocator<perfetto::protos::gen::OneofDescriptorProto>_>
             *)&local_38);
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(this->reserved_range_).
                super__Vector_base<perfetto::protos::gen::DescriptorProto_ReservedRange,_std::allocator<perfetto::protos::gen::DescriptorProto_ReservedRange>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pDVar5 = (param_1->reserved_range_).
           super__Vector_base<perfetto::protos::gen::DescriptorProto_ReservedRange,_std::allocator<perfetto::protos::gen::DescriptorProto_ReservedRange>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->reserved_range_).
                super__Vector_base<perfetto::protos::gen::DescriptorProto_ReservedRange,_std::allocator<perfetto::protos::gen::DescriptorProto_ReservedRange>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(this->reserved_range_).
                super__Vector_base<perfetto::protos::gen::DescriptorProto_ReservedRange,_std::allocator<perfetto::protos::gen::DescriptorProto_ReservedRange>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->reserved_range_).
  super__Vector_base<perfetto::protos::gen::DescriptorProto_ReservedRange,_std::allocator<perfetto::protos::gen::DescriptorProto_ReservedRange>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->reserved_range_).
       super__Vector_base<perfetto::protos::gen::DescriptorProto_ReservedRange,_std::allocator<perfetto::protos::gen::DescriptorProto_ReservedRange>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->reserved_range_).
  super__Vector_base<perfetto::protos::gen::DescriptorProto_ReservedRange,_std::allocator<perfetto::protos::gen::DescriptorProto_ReservedRange>_>
  ._M_impl.super__Vector_impl_data._M_finish = pDVar5;
  (this->reserved_range_).
  super__Vector_base<perfetto::protos::gen::DescriptorProto_ReservedRange,_std::allocator<perfetto::protos::gen::DescriptorProto_ReservedRange>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->reserved_range_).
       super__Vector_base<perfetto::protos::gen::DescriptorProto_ReservedRange,_std::allocator<perfetto::protos::gen::DescriptorProto_ReservedRange>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->reserved_range_).
  super__Vector_base<perfetto::protos::gen::DescriptorProto_ReservedRange,_std::allocator<perfetto::protos::gen::DescriptorProto_ReservedRange>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->reserved_range_).
  super__Vector_base<perfetto::protos::gen::DescriptorProto_ReservedRange,_std::allocator<perfetto::protos::gen::DescriptorProto_ReservedRange>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->reserved_range_).
  super__Vector_base<perfetto::protos::gen::DescriptorProto_ReservedRange,_std::allocator<perfetto::protos::gen::DescriptorProto_ReservedRange>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<perfetto::protos::gen::DescriptorProto_ReservedRange,_std::allocator<perfetto::protos::gen::DescriptorProto_ReservedRange>_>
  ::~vector((vector<perfetto::protos::gen::DescriptorProto_ReservedRange,_std::allocator<perfetto::protos::gen::DescriptorProto_ReservedRange>_>
             *)&local_38);
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(this->reserved_name_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pbVar6 = (param_1->reserved_name_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->reserved_name_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(this->reserved_name_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->reserved_name_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->reserved_name_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->reserved_name_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar6;
  (this->reserved_name_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->reserved_name_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->reserved_name_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->reserved_name_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->reserved_name_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_38);
  ::std::__cxx11::string::operator=
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return this;
}

Assistant:

bool DescriptorProto::operator==(const DescriptorProto& other) const {
  return unknown_fields_ == other.unknown_fields_
   && name_ == other.name_
   && field_ == other.field_
   && extension_ == other.extension_
   && nested_type_ == other.nested_type_
   && enum_type_ == other.enum_type_
   && oneof_decl_ == other.oneof_decl_
   && reserved_range_ == other.reserved_range_
   && reserved_name_ == other.reserved_name_;
}